

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall SummedArea_Rect_Test::TestBody(SummedArea_Rect_Test *this)

{
  Allocator alloc;
  allocator_type allocator;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float line;
  AssertionResult gtest_ar;
  Bounds2f b;
  int x_1;
  int y_1;
  Float mySum;
  int x1;
  int y1;
  int x0;
  int y0;
  SummedAreaTable sat;
  int x;
  int y;
  Array2D<float> v;
  char *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  Float in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  AssertionResult local_c0 [3];
  int local_8c;
  int local_88;
  float local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_48;
  int local_34;
  Array2D<float> local_28;
  
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  allocator.memoryResource._4_4_ = in_stack_fffffffffffffed4;
  allocator.memoryResource._0_4_ = in_stack_fffffffffffffed0;
  pbrt::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,allocator);
  local_34 = 0;
  while (iVar2 = local_34, iVar1 = pbrt::Array2D<float>::ySize(&local_28), iVar2 < iVar1) {
    local_48 = 0;
    while (in_stack_ffffffffffffff18 = local_48,
          in_stack_ffffffffffffff1c = pbrt::Array2D<float>::xSize(&local_28),
          in_stack_ffffffffffffff18 < in_stack_ffffffffffffff1c) {
      iVar2 = local_48 + local_34;
      pfVar6 = pbrt::Array2D<float>::operator()
                         ((Array2D<float> *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffeac,(int)in_stack_fffffffffffffea8);
      *pfVar6 = (float)iVar2;
      local_48 = local_48 + 1;
    }
    local_34 = local_34 + 1;
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  alloc.memoryResource._4_4_ = in_stack_fffffffffffffeb4;
  alloc.memoryResource._0_4_ = in_stack_fffffffffffffeb0;
  pbrt::SummedAreaTable::SummedAreaTable
            ((SummedAreaTable *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (Array2D<float> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),alloc);
  for (local_74 = 0; iVar4 = local_74, iVar3 = pbrt::Array2D<float>::ySize(&local_28), iVar4 < iVar3
      ; local_74 = local_74 + 1) {
    for (local_78 = 0; iVar4 = local_78, iVar3 = pbrt::Array2D<float>::xSize(&local_28),
        iVar4 < iVar3; local_78 = local_78 + 1) {
      for (local_7c = local_74; iVar4 = local_7c, iVar3 = pbrt::Array2D<float>::ySize(&local_28),
          iVar4 < iVar3; local_7c = local_7c + 1) {
        for (local_80 = local_78; iVar4 = local_80, iVar3 = pbrt::Array2D<float>::xSize(&local_28),
            iVar4 < iVar3; local_80 = local_80 + 1) {
          local_84 = 0.0;
          for (local_88 = local_74; local_88 < local_7c; local_88 = local_88 + 1) {
            for (local_8c = local_78; local_8c < local_80; local_8c = local_8c + 1) {
              pfVar6 = pbrt::Array2D<float>::operator()
                                 ((Array2D<float> *)
                                  CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                  in_stack_fffffffffffffeac,(int)in_stack_fffffffffffffea8);
              local_84 = *pfVar6 + local_84;
            }
          }
          fVar7 = (float)local_78;
          iVar4 = pbrt::Array2D<float>::xSize(&local_28);
          fVar7 = fVar7 / (float)iVar4;
          fVar8 = (float)local_74;
          iVar4 = pbrt::Array2D<float>::ySize(&local_28);
          pbrt::Point2<float>::Point2
                    ((Point2<float> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     SUB84(in_stack_fffffffffffffe98,0));
          fVar9 = (float)local_80;
          iVar3 = pbrt::Array2D<float>::xSize(&local_28);
          fVar10 = fVar9 / (float)iVar3;
          line = (float)local_7c;
          iVar5 = pbrt::Array2D<float>::ySize(&local_28);
          pbrt::Point2<float>::Point2
                    ((Point2<float> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     SUB84(in_stack_fffffffffffffe98,0));
          pbrt::Bounds2<float>::Bounds2
                    ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                     ,(Point2<float> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                     ,(Point2<float> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
                    );
          in_stack_fffffffffffffeb0 = local_84;
          in_stack_fffffffffffffeb4 = pbrt::Array2D<float>::xSize(&local_28);
          in_stack_fffffffffffffeac = pbrt::Array2D<float>::ySize(&local_28);
          in_stack_fffffffffffffea8 =
               pbrt::SummedAreaTable::Sum
                         ((SummedAreaTable *)CONCAT44(iVar4,fVar8),(Bounds2f *)CONCAT44(fVar7,iVar3)
                         );
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((char *)CONCAT44(line,fVar10),
                     (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (float *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
          in_stack_fffffffffffffea7 = testing::AssertionResult::operator_cast_to_bool(local_c0);
          if (!(bool)in_stack_fffffffffffffea7) {
            testing::Message::Message((Message *)CONCAT44(iVar4,fVar8));
            in_stack_fffffffffffffe98 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x64b7b7);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT44(iVar4,fVar8),(Type)fVar7,
                       (char *)CONCAT44(fVar9,iVar5),(int)line,
                       (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(iVar1,iVar2),
                       (Message *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)
                      );
            testing::Message::~Message((Message *)0x64b812);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x64b867);
        }
      }
    }
  }
  pbrt::SummedAreaTable::~SummedAreaTable((SummedAreaTable *)0x64b8e1);
  pbrt::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

TEST(SummedArea, Rect) {
    Array2D<Float> v(8, 4);

    for (int y = 0; y < v.ySize(); ++y)
        for (int x = 0; x < v.xSize(); ++x)
            v(x, y) = x + y;

    SummedAreaTable sat(v);

    // All boxes that line up with boundaries exactly
    for (int y0 = 0; y0 < v.ySize(); ++y0)
        for (int x0 = 0; x0 < v.xSize(); ++x0)
            for (int y1 = y0; y1 < v.ySize(); ++y1)
                for (int x1 = x0; x1 < v.xSize(); ++x1) {
                    Float mySum = 0;
                    for (int y = y0; y < y1; ++y)
                        for (int x = x0; x < x1; ++x)
                            mySum += v(x, y);

                    Bounds2f b(Point2f(Float(x0) / v.xSize(), Float(y0) / v.ySize()),
                               Point2f(Float(x1) / v.xSize(), Float(y1) / v.ySize()));
                    EXPECT_EQ(mySum / (v.xSize() * v.ySize()), sat.Sum(b));
                }
}